

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

vm_obj_id_t CVmObjDate::create_from_time_t(int in_root_set,time_t t)

{
  vm_obj_id_t vVar1;
  double dVar2;
  
  dVar2 = floor((double)t / 86400.0);
  vVar1 = create(in_root_set,(int)(dVar2 + 719468.0),(int)(((double)t - dVar2 * 86400.0) * 1000.0));
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjDate::create_from_time_t(VMG_ int in_root_set, os_time_t t)
{
    /* 
     *   turn the time_t into days and milliseconds after the Unix Epoch (use
     *   doubles to ensure we don't overflow an int) 
     */
    double d = (double)t;
    double dn = floor(d / (24*60*60));
    double dms = (d - (dn * (24*60*60))) * 1000;

    /* adjust to our internal Epoch */
    dn += caldate_t::UNIX_EPOCH_DAYNO;

    /* we have the time in our own format now, so go create the object */
    return create(vmg_ in_root_set, (int32_t)dn, (int32_t)dms);
}